

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<DataStream,transaction_identifier<false>,unsigned_int>
               (DataStream *s,transaction_identifier<false> *args,uint *args_1)

{
  long lVar1;
  long in_FS_OFFSET;
  DataStream *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,_transaction_identifier<false>_>
            (in_stack_ffffffffffffffd8,(transaction_identifier<false> *)0x811ca4);
  Serialize<DataStream>(in_stack_ffffffffffffffd8,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}